

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_dateTime(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  undefined1 *__src;
  void *pvVar10;
  bool bVar11;
  StrX local_870;
  StrX local_860;
  StrX local_850;
  long local_840;
  XMLCh *actRetCanRep_7;
  undefined1 local_830 [4];
  Status myStatus_23;
  StrX local_820;
  StrX local_810;
  long local_800;
  XMLCh *actRetCanRep_6;
  undefined1 local_7f0 [4];
  Status myStatus_22;
  StrX local_7e0;
  StrX local_7d0;
  long local_7c0;
  XMLCh *actRetCanRep_5;
  undefined1 local_7b0 [4];
  Status myStatus_21;
  StrX local_7a0;
  StrX local_790;
  long local_780;
  XMLCh *actRetCanRep_4;
  undefined1 local_770 [4];
  Status myStatus_20;
  StrX local_760;
  StrX local_750;
  long local_740;
  XMLCh *actRetCanRep_3;
  undefined1 local_730 [4];
  Status myStatus_19;
  StrX local_720;
  char *local_710;
  char *actRetCanRep_inchar_2;
  wchar16 *local_6f8;
  XMLCh *actRetCanRep_2;
  undefined1 local_6e8 [4];
  Status myStatus_18;
  StrX local_6d8;
  char *local_6c8;
  char *actRetCanRep_inchar_1;
  wchar16 *local_6b0;
  XMLCh *actRetCanRep_1;
  undefined1 local_6a0 [4];
  Status myStatus_17;
  StrX local_690;
  char *local_680;
  char *actRetCanRep_inchar;
  wchar16 *local_668;
  XMLCh *actRetCanRep;
  Status myStatus_16;
  int j;
  StrX local_648;
  StrX local_638;
  XSValue *local_628;
  XSValue *actRetValue_7;
  undefined1 local_618 [4];
  Status myStatus_15;
  StrX local_608;
  StrX local_5f8;
  XSValue *local_5e8;
  XSValue *actRetValue_6;
  undefined1 local_5d8 [4];
  Status myStatus_14;
  StrX local_5c8;
  StrX local_5b8;
  XSValue *local_5a8;
  XSValue *actRetValue_5;
  undefined1 local_598 [4];
  Status myStatus_13;
  StrX local_588;
  StrX local_578;
  XSValue *local_568;
  XSValue *actRetValue_4;
  undefined1 local_558 [4];
  Status myStatus_12;
  StrX local_548;
  StrX local_538;
  XSValue *local_528;
  XSValue *actRetValue_3;
  undefined1 local_518 [4];
  Status myStatus_11;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  StrX local_4b8;
  XSValue *local_4a8;
  XSValue *actRetValue_2;
  undefined1 local_498 [4];
  Status myStatus_10;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  StrX local_438;
  XSValue *local_428;
  XSValue *actRetValue_1;
  undefined1 local_418 [4];
  Status myStatus_9;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  StrX local_3b8;
  XSValue *local_3a8;
  XSValue *actRetValue;
  Status myStatus_8;
  int i;
  StrX local_388;
  StrX local_378;
  byte local_365;
  Status local_364;
  undefined1 local_360 [3];
  bool actRetValid_7;
  Status myStatus_7;
  StrX local_350;
  StrX local_340;
  byte local_32d;
  Status local_32c;
  undefined1 local_328 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_318;
  StrX local_308;
  byte local_2f5;
  Status local_2f4;
  undefined1 local_2f0 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_2e0;
  StrX local_2d0;
  byte local_2bd;
  Status local_2bc;
  undefined1 local_2b8 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_2a8;
  StrX local_298;
  byte local_285;
  Status local_284;
  undefined1 local_280 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_270;
  byte local_25d;
  Status local_25c;
  undefined1 local_258 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_248;
  byte local_235;
  Status local_234;
  undefined1 local_230 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_210;
  byte local_1fd;
  Status local_1fc;
  char acStack_1f8 [3];
  bool actRetValid;
  Status myStatus;
  char v_3_canrep [21];
  char acStack_1d8 [8];
  char v_2_canrep [21];
  char local_1b8 [8];
  char v_1_canrep [26];
  undefined1 local_190 [8];
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_5 [26];
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char iv_4 [23];
  char acStack_d8 [8];
  char iv_3 [23];
  char acStack_b8 [8];
  char iv_2 [22];
  char acStack_98 [8];
  char iv_1 [20];
  char local_78 [8];
  char v_3 [26];
  char v_2 [26];
  char v_1 [32];
  bool toValidate;
  DataType dt;
  
  stack0xffffffffffffffc8 = 0x2d30303032202020;
  v_2[8] = ':';
  v_2[9] = '2';
  v_2[10] = '0';
  v_2[0xb] = '+';
  v_2[0xc] = '1';
  v_2[0xd] = '3';
  v_2[0xe] = ':';
  v_2[0xf] = '3';
  v_2[0x10] = '0';
  v_2[0x11] = '\0';
  stack0xffffffffffffffa8 = 0x2d30312d30303032;
  v_2[0] = '0';
  v_2[1] = '1';
  v_2[2] = 'T';
  v_2[3] = '1';
  v_2[4] = '1';
  v_2[5] = ':';
  v_2[6] = '1';
  v_2[7] = '0';
  v_3[8] = ':';
  v_3[9] = '2';
  v_3[10] = '0';
  v_3[0xb] = '-';
  v_3[0xc] = '0';
  v_3[0xd] = '6';
  v_3[0xe] = ':';
  v_3[0xf] = '0';
  v_3[0x10] = '0';
  v_3[0x11] = '\0';
  builtin_strncpy(local_78,"2000-10-",8);
  v_3[0] = '0';
  v_3[1] = '1';
  v_3[2] = 'T';
  v_3[3] = '1';
  v_3[4] = '1';
  v_3[5] = ':';
  v_3[6] = '1';
  v_3[7] = '0';
  builtin_strncpy(acStack_98,"0000-12-",8);
  builtin_strncpy(iv_1,"31T23:59:59",0xc);
  builtin_strncpy(iv_2 + 8,"9:59Z",6);
  builtin_strncpy(acStack_b8,"+2000-11",8);
  builtin_strncpy(iv_2,"-30T23:5",8);
  builtin_strncpy(iv_3,"28T23:59.1:59Z",0xf);
  builtin_strncpy(acStack_d8,"2000-02-",8);
  iv_5[0x18] = '2';
  iv_5[0x19] = '0';
  cStack_f6 = '0';
  cStack_f5 = '0';
  cStack_f4 = '-';
  cStack_f3 = '1';
  cStack_f2 = '1';
  cStack_f1 = '-';
  builtin_strncpy(iv_5 + 8,":01Z10:61",10);
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 5.580470144199089e-91;
  builtin_strncpy(iv_5,"28T01:01",8);
  builtin_strncpy(v_1_canrep + 8,":59.00389",10);
  builtin_strncpy(local_1b8,"2000-12-",8);
  builtin_strncpy(v_1_canrep,"31T23:59",8);
  builtin_strncpy(v_2_canrep + 8,":20Z",5);
  builtin_strncpy(acStack_1d8,"2000-09-",8);
  builtin_strncpy(v_2_canrep,"30T21:40",8);
  builtin_strncpy(v_3_canrep + 8,":20Z",5);
  acStack_1f8[0] = '2';
  acStack_1f8[1] = '0';
  acStack_1f8[2] = '0';
  actRetValid = true;
  myStatus._0_1_ = '-';
  myStatus._1_1_ = '1';
  myStatus._2_1_ = '0';
  myStatus._3_1_ = '-';
  builtin_strncpy(v_3_canrep,"01T17:10",8);
  act_v_ran_v_1.f_datatype = 2000;
  act_v_ran_v_1._4_4_ = 0xc;
  act_v_ran_v_1.fValue.f_int = 0x1f;
  act_v_ran_v_1.fValue.f_datetime.f_month = 0x17;
  act_v_ran_v_1.fValue.f_datetime.f_day = 0x3b;
  act_v_ran_v_1.fValue.f_datetime.f_hour = 0x3b;
  act_v_ran_v_1.fValue._16_8_ = 0x3f6fddebd9018e75;
  act_v_ran_v_2.f_datatype = 2000;
  act_v_ran_v_2._4_4_ = 9;
  act_v_ran_v_2.fValue.f_int = 0x1e;
  act_v_ran_v_2.fValue.f_datetime.f_month = 0x15;
  act_v_ran_v_2.fValue.f_datetime.f_day = 0x28;
  act_v_ran_v_2.fValue.f_datetime.f_hour = 0x14;
  act_v_ran_v_2.fValue._16_8_ = 0;
  act_v_ran_v_3.f_datatype = 2000;
  act_v_ran_v_3._4_4_ = 10;
  act_v_ran_v_3.fValue.f_int = 1;
  act_v_ran_v_3.fValue.f_datetime.f_month = 0x11;
  act_v_ran_v_3.fValue.f_datetime.f_day = 10;
  act_v_ran_v_3.fValue.f_datetime.f_hour = 0x14;
  act_v_ran_v_3.fValue._16_8_ = 0;
  local_1fc = st_Init;
  StrX::StrX(&local_210,v_2 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_210);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_1fc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_210);
  local_1fd = bVar1 & 1;
  if (local_1fd != 1) {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX((StrX *)local_230,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_230);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1226,v_2 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_230);
    errSeen = true;
  }
  local_234 = st_Init;
  StrX::StrX(&local_248,v_3 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_248);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_234,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_248);
  local_235 = bVar1 & 1;
  if (local_235 != 1) {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX((StrX *)local_258,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_258);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1227,v_3 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_258);
    errSeen = true;
  }
  local_25c = st_Init;
  StrX::StrX(&local_270,local_78);
  pXVar3 = StrX::unicodeForm(&local_270);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_25c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_270);
  local_25d = bVar1 & 1;
  if (local_25d != 1) {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX((StrX *)local_280,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_280);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1228,local_78,pcVar4,1);
    StrX::~StrX((StrX *)local_280);
    errSeen = true;
  }
  local_284 = st_Init;
  StrX::StrX(&local_298,acStack_98);
  pXVar3 = StrX::unicodeForm(&local_298);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_284,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_298);
  local_285 = bVar1 & 1;
  if (local_285 == 0) {
    if (local_284 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_2b8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_2b8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_284);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122b,acStack_98,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_2b8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX(&local_2a8,pXVar3);
    pcVar4 = StrX::localForm(&local_2a8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122b,acStack_98,pcVar4,0);
    StrX::~StrX(&local_2a8);
    errSeen = true;
  }
  local_2bc = st_Init;
  StrX::StrX(&local_2d0,acStack_b8);
  pXVar3 = StrX::unicodeForm(&local_2d0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_2bc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_2d0);
  local_2bd = bVar1 & 1;
  if (local_2bd == 0) {
    if (local_2bc != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_2f0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_2f0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_2bc);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122c,acStack_b8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_2f0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX(&local_2e0,pXVar3);
    pcVar4 = StrX::localForm(&local_2e0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122c,acStack_b8,pcVar4,0);
    StrX::~StrX(&local_2e0);
    errSeen = true;
  }
  local_2f4 = st_Init;
  StrX::StrX(&local_308,acStack_d8);
  pXVar3 = StrX::unicodeForm(&local_308);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_2f4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_308);
  local_2f5 = bVar1 & 1;
  if (local_2f5 == 0) {
    if (local_2f4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_328,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_328);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_2f4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122d,acStack_d8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_328);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX(&local_318,pXVar3);
    pcVar4 = StrX::localForm(&local_318);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122d,acStack_d8,pcVar4,0);
    StrX::~StrX(&local_318);
    errSeen = true;
  }
  local_32c = st_Init;
  StrX::StrX(&local_340,iv_5 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_340);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_32c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_340);
  local_32d = bVar1 & 1;
  if (local_32d == 0) {
    if (local_32c != st_FODT0003) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_360,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_360);
      pcVar6 = getStatusString(st_FODT0003);
      pcVar7 = getStatusString(local_32c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122e,iv_5 + 0x18,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_360);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX(&local_350,pXVar3);
    pcVar4 = StrX::localForm(&local_350);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122e,iv_5 + 0x18,pcVar4,0);
    StrX::~StrX(&local_350);
    errSeen = true;
  }
  local_364 = st_Init;
  StrX::StrX(&local_378,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_378);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_dateTime,&local_364,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_378);
  local_365 = bVar1 & 1;
  if (local_365 == 0) {
    if (local_364 != st_FODT0003) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)&myStatus_8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_8);
      pcVar6 = getStatusString(st_FODT0003);
      pcVar7 = getStatusString(local_364);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122f,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_dateTime);
    StrX::StrX(&local_388,pXVar3);
    pcVar4 = StrX::localForm(&local_388);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122f,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_388);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_3b8,v_2 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_3b8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3b8);
    local_3a8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_418,pXVar3);
      StrX::localForm((StrX *)local_418);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1249,v_2 + 0x18);
      StrX::~StrX((StrX *)local_418);
      errSeen = true;
    }
    else {
      memcpy(&local_3e0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_408,pvVar10,0x28);
      actValue.fValue.f_long = uStack_3d8;
      actValue._0_8_ = local_3e0;
      actValue.fValue._8_8_ = local_3d0;
      actValue.fValue._16_8_ = uStack_3c8;
      actValue.fValue.f_datetime.f_milisec = (double)local_3c0;
      expValue.fValue.f_long = uStack_400;
      expValue._0_8_ = local_408;
      expValue.fValue._8_8_ = local_3f8;
      expValue.fValue._16_8_ = uStack_3f0;
      expValue.fValue.f_datetime.f_milisec = (double)local_3e8;
      bVar2 = compareActualValue(dt_dateTime,actValue,expValue);
      pXVar5 = local_3a8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_3a8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3a8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_438,v_3 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_438);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_438);
    local_428 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_498,pXVar3);
      StrX::localForm((StrX *)local_498);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124a,v_3 + 0x18);
      StrX::~StrX((StrX *)local_498);
      errSeen = true;
    }
    else {
      memcpy(&local_460,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_3.fValue + 0x18);
      memcpy(&local_488,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_458;
      actValue_00._0_8_ = local_460;
      actValue_00.fValue._8_8_ = local_450;
      actValue_00.fValue._16_8_ = uStack_448;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_440;
      expValue_00.fValue.f_long = uStack_480;
      expValue_00._0_8_ = local_488;
      expValue_00.fValue._8_8_ = local_478;
      expValue_00.fValue._16_8_ = uStack_470;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_468;
      bVar2 = compareActualValue(dt_dateTime,actValue_00,expValue_00);
      pXVar5 = local_428;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_428 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_428);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_4b8,local_78);
    pXVar3 = StrX::unicodeForm(&local_4b8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4b8);
    local_4a8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_518,pXVar3);
      StrX::localForm((StrX *)local_518);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124b,local_78);
      StrX::~StrX((StrX *)local_518);
      errSeen = true;
    }
    else {
      memcpy(&local_4e0,pXVar5,0x28);
      __src = local_190;
      memcpy(&local_508,__src,0x28);
      actValue_01.fValue.f_long = uStack_4d8;
      actValue_01._0_8_ = local_4e0;
      actValue_01.fValue._8_8_ = local_4d0;
      actValue_01.fValue._16_8_ = uStack_4c8;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_4c0;
      expValue_01.fValue.f_long = uStack_500;
      expValue_01._0_8_ = local_508;
      expValue_01.fValue._8_8_ = local_4f8;
      expValue_01.fValue._16_8_ = uStack_4f0;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_4e8;
      bVar2 = compareActualValue(dt_dateTime,actValue_01,expValue_01);
      pXVar5 = local_4a8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_4a8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4a8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,__src);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_538,acStack_98);
    pXVar3 = StrX::unicodeForm(&local_538);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_538);
    local_528 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_558,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_558);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124e,acStack_98,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_558);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_548,pXVar3);
      StrX::localForm(&local_548);
      pvVar10 = (void *)0x124e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124e,acStack_98);
      StrX::~StrX(&local_548);
      pXVar5 = local_528;
      errSeen = true;
      if (local_528 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_528);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_578,acStack_b8);
    pXVar3 = StrX::unicodeForm(&local_578);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_578);
    local_568 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_598,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_598);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124f,acStack_b8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_598);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_588,pXVar3);
      StrX::localForm(&local_588);
      pvVar10 = (void *)0x124f;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124f,acStack_b8);
      StrX::~StrX(&local_588);
      pXVar5 = local_568;
      errSeen = true;
      if (local_568 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_568);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_5b8,acStack_d8);
    pXVar3 = StrX::unicodeForm(&local_5b8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5b8);
    local_5a8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_5d8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_5d8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1250,acStack_d8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_5d8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_5c8,pXVar3);
      StrX::localForm(&local_5c8);
      pvVar10 = (void *)0x1250;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1250,acStack_d8);
      StrX::~StrX(&local_5c8);
      pXVar5 = local_5a8;
      errSeen = true;
      if (local_5a8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_5a8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_5f8,iv_5 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_5f8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5f8);
    local_5e8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FODT0003) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_618,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_618);
        pcVar6 = getStatusString(st_FODT0003);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1251,iv_5 + 0x18,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_618);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_608,pXVar3);
      StrX::localForm(&local_608);
      pvVar10 = (void *)0x1251;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1251,iv_5 + 0x18);
      StrX::~StrX(&local_608);
      pXVar5 = local_5e8;
      errSeen = true;
      if (local_5e8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_5e8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_7._4_4_ = st_Init;
    StrX::StrX(&local_638,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_638);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetValue_7 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_638);
    local_628 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_7._4_4_ != st_FODT0003) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)&myStatus_16,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_16);
        pcVar6 = getStatusString(st_FODT0003);
        pcVar7 = getStatusString(actRetValue_7._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1252,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_16);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_648,pXVar3);
      StrX::localForm(&local_648);
      pvVar10 = (void *)0x1252;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1252,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_648);
      pXVar5 = local_628;
      errSeen = true;
      if (local_628 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_628);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,v_2 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_dateTime,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_668 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_6a0,pXVar3);
      StrX::localForm((StrX *)local_6a0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x126e,v_2 + 0x18);
      StrX::~StrX((StrX *)local_6a0);
      errSeen = true;
    }
    else {
      local_680 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_680,local_1b8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX(&local_690,pXVar3);
        pcVar4 = StrX::localForm(&local_690);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x126e,v_2 + 0x18,pcVar4,local_680,local_1b8);
        StrX::~StrX(&local_690);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_668);
      xercesc_4_0::XMLString::release(&local_680,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,v_3 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_6b0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_6e8,pXVar3);
      StrX::localForm((StrX *)local_6e8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x126f,v_3 + 0x18);
      StrX::~StrX((StrX *)local_6e8);
      errSeen = true;
    }
    else {
      local_6c8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_6c8,acStack_1d8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX(&local_6d8,pXVar3);
        pcVar4 = StrX::localForm(&local_6d8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x126f,v_3 + 0x18,pcVar4,local_6c8,acStack_1d8);
        StrX::~StrX(&local_6d8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6b0);
      xercesc_4_0::XMLString::release(&local_6c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,local_78);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_dateTime,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_6f8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX((StrX *)local_730,pXVar3);
      StrX::localForm((StrX *)local_730);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1270,local_78);
      StrX::~StrX((StrX *)local_730);
      errSeen = true;
    }
    else {
      local_710 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_710,acStack_1f8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX(&local_720,pXVar3);
        pcVar4 = StrX::localForm(&local_720);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x1270,local_78,pcVar4,local_710,acStack_1f8);
        StrX::~StrX(&local_720);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6f8);
      xercesc_4_0::XMLString::release(&local_710,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_750,acStack_98);
    pXVar3 = StrX::unicodeForm(&local_750);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_dateTime,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_750);
    local_740 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_770,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_770);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1273,acStack_98,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_770);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_760,pXVar3);
      StrX::localForm(&local_760);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1273,acStack_98);
      StrX::~StrX(&local_760);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_740);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_790,acStack_b8);
    pXVar3 = StrX::unicodeForm(&local_790);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_dateTime,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_790);
    local_780 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_7b0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_7b0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1274,acStack_b8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_7b0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_7a0,pXVar3);
      StrX::localForm(&local_7a0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1274,acStack_b8);
      StrX::~StrX(&local_7a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_780);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_7d0,acStack_d8);
    pXVar3 = StrX::unicodeForm(&local_7d0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_dateTime,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_7d0);
    local_7c0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_7f0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_7f0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1275,acStack_d8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_7f0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_7e0,pXVar3);
      StrX::localForm(&local_7e0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1275,acStack_d8);
      StrX::~StrX(&local_7e0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_7c0);
      errSeen = true;
    }
    actRetCanRep_6._4_4_ = st_Init;
    StrX::StrX(&local_810,iv_5 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_810);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_dateTime,(Status *)((long)&actRetCanRep_6 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_810);
    local_800 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_6._4_4_ != st_FODT0003) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX((StrX *)local_830,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_830);
        pcVar6 = getStatusString(st_FODT0003);
        pcVar7 = getStatusString(actRetCanRep_6._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1276,iv_5 + 0x18,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_830);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_820,pXVar3);
      StrX::localForm(&local_820);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1276,iv_5 + 0x18);
      StrX::~StrX(&local_820);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_800);
      errSeen = true;
    }
    actRetCanRep_7._4_4_ = st_Init;
    StrX::StrX(&local_850,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_850);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_dateTime,(Status *)((long)&actRetCanRep_7 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_850);
    local_840 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_7._4_4_ != st_FODT0003) {
        pXVar3 = getDataTypeString(dt_dateTime);
        StrX::StrX(&local_870,pXVar3);
        pcVar4 = StrX::localForm(&local_870);
        pcVar6 = getStatusString(st_FODT0003);
        pcVar7 = getStatusString(actRetCanRep_7._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1277,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX(&local_870);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_dateTime);
      StrX::StrX(&local_860,pXVar3);
      StrX::localForm(&local_860);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1277,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_860);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_840);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_dateTime()
{
    const XSValue::DataType dt = XSValue::dt_dateTime;
    bool  toValidate = true;

    const char v_1[]="   2000-12-31T23:59:59.00389  \n";
    const char v_2[]="2000-10-01T11:10:20+13:30";
    const char v_3[]="2000-10-01T11:10:20-06:00";

    const char iv_1[]="0000-12-31T23:59:59";
    const char iv_2[]="+2000-11-30T23:59:59Z";
    const char iv_3[]="2000-02-28T23:59.1:59Z";
    const char iv_4[]="2000-11-30T01:01:01Z99";
    const char iv_5[]="2000-02-28T01:01:01Z10:61";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="2000-12-31T23:59:59.00389";
    const char v_2_canrep[]="2000-09-30T21:40:20Z";
    const char v_3_canrep[]="2000-10-01T17:10:20Z";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 12;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 23;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 59;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 59;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0.00389;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 9;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 21;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 40;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 10;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 17;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 10;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

 /***
 * E2-41
 *
 *  3.2.7.2 Canonical representation
 *
 *  Except for trailing fractional zero digits in the seconds representation,
 *  '24:00:00' time representations, and timezone (for timezoned values),
 *  the mapping from literals to values is one-to-one. Where there is more
 *  than one possible representation, the canonical representation is as follows:
 *  redundant trailing zero digits in fractional-second literals are prohibited.
 *  An hour representation of '24' is prohibited. Timezoned values are canonically
 *  represented by appending 'Z' to the nontimezoned representation. (All
 *  timezoned dateTime values are UTC.)
 *
 *  .'24:00:00' -> '00:00:00'
 *  .milisecond: trailing zeros removed
 *  .'Z'
 *
 ***/

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_4, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);
    VALIDATE_TEST(iv_5, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_4, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
        ACTVALUE_TEST(iv_5, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_4, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);
        CANREP_TEST(iv_5, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);

    }

}